

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

Color __thiscall Renderer::radiance(Renderer *this,Ray ray,Sampler *sampler)

{
  double dVar1;
  Color CVar2;
  vec3f *pvVar3;
  bool bVar4;
  bool bVar5;
  reference ppLVar6;
  undefined8 *in_RSI;
  float *in_RDI;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  double dVar10;
  double dVar11;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined1 auVar12 [16];
  vec3f vVar14;
  undefined1 auVar15 [12];
  vec3f vVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fStack0000000000000008;
  float fStack000000000000000c;
  float fStack0000000000000010;
  float fStack0000000000000014;
  float fStack0000000000000018;
  float fStack000000000000001c;
  float p;
  float t;
  Color f;
  vec3f newdir;
  HitInfo shadowhit;
  Ray shadowray;
  Color f_1;
  Color irr;
  float dist;
  vec3f dirToLight;
  Light *l_1;
  iterator __end2;
  iterator __begin2;
  vector<Light_*,_std::allocator<Light_*>_> *__range2;
  BSDF *bsdf;
  Light *l;
  iterator __end3;
  iterator __begin3;
  vector<Light_*,_std::allocator<Light_*>_> *__range3;
  HitInfo hit;
  int nbounce;
  bool lastDirac;
  Color through;
  Color result;
  vector<Light_*,_std::allocator<Light_*>_> *in_stack_fffffffffffffb78;
  vec3f *in_stack_fffffffffffffb80;
  vec3f *in_stack_fffffffffffffb88;
  vec3f *in_stack_fffffffffffffb90;
  Ray local_3b0;
  vec3f local_398;
  vec3f local_388;
  float local_37c;
  float local_378;
  vec3f local_374;
  vec3f local_368;
  vec3f local_354;
  undefined8 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined1 local_318 [12];
  vec3f local_30c;
  vec3f local_300;
  vec3f local_2f0;
  vec3f local_2e0;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  vec3f local_2b4;
  vec3f local_2a8;
  undefined8 local_294;
  float local_28c;
  Hit local_288;
  vec3f local_238;
  undefined8 local_228;
  float local_220;
  vec3f local_218;
  vec3f local_208;
  vec3f local_1f8;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  Ray local_1cc;
  vec3f local_1b4;
  vec3f local_1a8;
  vec3f local_198;
  undefined8 local_188;
  float local_180;
  vec3f local_17c;
  undefined4 local_168;
  undefined4 local_158;
  float local_150;
  vec3f local_14c;
  Light *local_140;
  Light **local_138;
  __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_> local_130;
  float *local_128;
  vec3f *local_120;
  vec3f local_118;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  vec3f local_ec;
  vec3f local_e0 [2];
  undefined4 local_c8;
  undefined4 local_b8;
  vec3f local_b4;
  Light *local_a8;
  Light **local_a0;
  __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_> local_98;
  float *local_90;
  Hit local_88;
  long *local_40;
  int local_34;
  byte local_2d;
  vec3f local_2c;
  undefined8 *local_20;
  vec3f local_c;
  undefined1 auVar13 [12];
  
  local_20 = in_RSI;
  vec3f::vec3f(&local_2c,1.0);
  vec3f::vec3f(&local_c);
  auVar15._8_4_ = in_stack_fffffffffffffcc0;
  auVar15._0_8_ = in_stack_fffffffffffffcb8;
  local_2d = 1;
  local_34 = 0;
  while( true ) {
    if ((int)in_RDI[1] < local_34) goto LAB_0013fe9c;
    (**(code **)**(undefined8 **)(in_RDI + 0x16))
              (&local_88,*(undefined8 **)(in_RDI + 0x16),&stack0x00000008);
    auVar17._8_8_ = extraout_XMM1_Qb;
    auVar17._0_8_ = extraout_XMM1_Qa;
    bVar4 = Primitive::Hit::operator_cast_to_bool(&local_88);
    if (!bVar4) break;
    if ((local_40[1] != 0) && (((local_2d & 1) != 0 || ((*(byte *)(local_40[1] + 8) & 1) == 0)))) {
      auVar17 = (**(code **)(*(long *)local_40[1] + 8))((long *)local_40[1],&stack0x00000008);
      auVar18._0_8_ = auVar17._8_8_;
      local_108 = auVar17._0_8_;
      auVar18._8_8_ = extraout_XMM1_Qb_00;
      auVar13 = auVar18._4_12_;
      local_100 = auVar17._8_4_;
      local_f8 = local_108;
      local_f0 = local_100;
      vVar14 = ::operator*(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      auVar17._0_4_ = vVar14.z;
      auVar17._4_12_ = auVar13;
      local_118._0_8_ = vVar14._0_8_;
      local_ec.x = local_118.x;
      local_ec.y = local_118.y;
      local_118 = vVar14;
      local_ec.z = auVar17._0_4_;
      operator+=(&local_c,&local_ec);
    }
    local_120 = (vec3f *)*local_40;
    if (local_120 == (vec3f *)0x0) goto LAB_0013fe9c;
    BSDF::bump((BSDF *)CONCAT44(in_stack_fffffffffffffcc4,auVar15._8_4_),auVar15._0_8_);
    local_128 = in_RDI + 10;
    local_130._M_current =
         (Light **)std::vector<Light_*,_std::allocator<Light_*>_>::begin(in_stack_fffffffffffffb78);
    local_138 = (Light **)
                std::vector<Light_*,_std::allocator<Light_*>_>::end(in_stack_fffffffffffffb78);
    while( true ) {
      uVar8 = auVar17._0_4_;
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                          *)in_stack_fffffffffffffb80,
                         (__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                          *)in_stack_fffffffffffffb78);
      if (!bVar4) break;
      ppLVar6 = __gnu_cxx::
                __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
                operator*(&local_130);
      local_140 = *ppLVar6;
      vec3f::vec3f(&local_14c);
      (**local_140->_vptr_Light)(local_140,&local_88.p,&local_14c,&local_150,local_20);
      local_168 = uVar8;
      pvVar3 = local_120;
      local_158 = local_168;
      vVar14 = ::operator-(in_stack_fffffffffffffb80);
      local_198.z = vVar14.z;
      local_180 = local_198.z;
      local_198._0_8_ = vVar14._0_8_;
      local_188._0_4_ = local_198.x;
      local_188._4_4_ = local_198.y;
      local_198 = vVar14;
      auVar18 = (*(code *)**(undefined8 **)pvVar3)(pvVar3,&local_188,&local_14c,&local_88);
      auVar17._0_8_ = auVar18._8_8_;
      local_1a8._0_8_ = auVar18._0_8_;
      auVar17._8_8_ = extraout_XMM1_Qb_01;
      local_1a8.z = auVar18._8_4_;
      local_17c._0_8_ = local_1a8._0_8_;
      local_17c.z = local_1a8.z;
      vec3f::vec3f(&local_1b4,0.0);
      bVar4 = ::operator==(&local_17c,&local_1b4);
      if (!bVar4) {
        local_150 = local_150 - *in_RDI;
        vVar14 = ::operator*(SUB84(in_stack_fffffffffffffb88,0),in_stack_fffffffffffffb80);
        local_1f8.z = vVar14.z;
        local_1e0 = local_1f8.z;
        local_1f8._0_8_ = vVar14._0_8_;
        local_1e8._0_4_ = local_1f8.x;
        local_1e8._4_4_ = local_1f8.y;
        local_1f8 = vVar14;
        vVar14 = ::operator+(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        local_208.z = vVar14.z;
        local_1d0 = local_208.z;
        local_208._0_8_ = vVar14._0_8_;
        local_1d8._0_4_ = local_208.x;
        local_1d8._4_4_ = local_208.y;
        local_218.z = local_14c.z;
        local_218.x = local_14c.x;
        local_218.y = local_14c.y;
        local_220 = local_208.z;
        local_228._0_4_ = local_208.x;
        local_228._4_4_ = local_208.y;
        local_238.z = local_14c.z;
        local_238.x = local_14c.x;
        local_238.y = local_14c.y;
        vVar16.z = local_14c.z;
        vVar16.x = local_14c.x;
        vVar16.y = local_14c.y;
        local_208 = vVar14;
        Ray::Ray(&local_1cc,vVar14,vVar16);
        (**(code **)**(undefined8 **)(in_RDI + 0x16))
                  (&local_288,*(undefined8 **)(in_RDI + 0x16),&local_1cc);
        auVar17._8_8_ = extraout_XMM1_Qb_02;
        auVar17._0_8_ = extraout_XMM1_Qa_00;
        bVar5 = Primitive::Hit::operator_cast_to_bool(&local_288);
        bVar4 = true;
        if (bVar5) {
          vVar14 = ::operator-(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          local_2a8._0_8_ = vVar14._0_8_;
          local_294._0_4_ = local_2a8.x;
          local_294._4_4_ = local_2a8.y;
          local_2a8.z = vVar14.z;
          local_28c = local_2a8.z;
          local_2a8 = vVar14;
          fVar7 = norm((vec3f *)0x13f937);
          fVar9 = (1.0 - *in_RDI) * local_150;
          auVar17 = ZEXT416((uint)fVar9);
          bVar4 = fVar9 < fVar7;
        }
        if (bVar4) {
          vVar14 = ::operator*(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          local_2e0.z = vVar14.z;
          local_2c8 = local_2e0.z;
          local_2e0._0_8_ = vVar14._0_8_;
          local_2d0._0_4_ = local_2e0.x;
          local_2d0._4_4_ = local_2e0.y;
          local_2e0 = vVar14;
          vVar14 = ::operator*(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          local_2f0.z = vVar14.z;
          local_2b8 = local_2f0.z;
          local_2f0._0_8_ = vVar14._0_8_;
          local_2c0._0_4_ = local_2f0.x;
          local_2c0._4_4_ = local_2f0.y;
          local_2f0 = vVar14;
          dot(&local_88.Ns,&local_14c);
          auVar12._0_12_ = ZEXT412(0xffffffff) << 0x40;
          auVar12._12_4_ = 0x7fffffff;
          auVar15 = auVar12._4_12_;
          vVar14 = ::operator*(in_stack_fffffffffffffb90,
                               (float)((ulong)in_stack_fffffffffffffb88 >> 0x20));
          auVar17._0_4_ = vVar14.z;
          auVar17._4_12_ = auVar15;
          local_300._0_8_ = vVar14._0_8_;
          local_2b4.x = local_300.x;
          local_2b4.y = local_300.y;
          local_300 = vVar14;
          local_2b4.z = auVar17._0_4_;
          operator+=(&local_c,&local_2b4);
        }
      }
      __gnu_cxx::__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
      operator++(&local_130);
    }
    in_stack_fffffffffffffb90 = &local_30c;
    vec3f::vec3f(in_stack_fffffffffffffb90);
    in_stack_fffffffffffffb88 = local_120;
    vVar14 = ::operator-(in_stack_fffffffffffffb80);
    local_330 = vVar14.z;
    local_320 = local_330;
    local_338 = vVar14._0_8_;
    local_328 = local_338;
    auVar15 = (**(code **)(*(long *)in_stack_fffffffffffffb88 + 8))
                        (in_stack_fffffffffffffb88,&local_328,in_stack_fffffffffffffb90,&local_88,
                         &local_2d,local_20);
    local_318 = auVar15;
    dot(in_stack_fffffffffffffb90,&local_88.Ns);
    vVar14 = ::operator*(SUB84(in_stack_fffffffffffffb88,0),in_stack_fffffffffffffb80);
    local_368._0_8_ = vVar14._0_8_;
    local_354.x = local_368.x;
    local_354.y = local_368.y;
    local_368.z = vVar14.z;
    local_354.z = local_368.z;
    local_368 = vVar14;
    operator*=(&local_2c,&local_354);
    vec3f::vec3f(&local_374);
    bVar5 = ::operator==(&local_2c,&local_374);
    bVar4 = true;
    if (!bVar5) {
      fVar7 = sqrlen(&local_2c);
      bVar4 = 1e+20 <= fVar7;
    }
    if (bVar4) goto LAB_0013fe9c;
    dVar1 = (double)local_2c.x;
    dVar10 = (double)local_2c.y;
    dVar11 = dVar10;
    if (dVar10 <= dVar1) {
      dVar11 = dVar1;
    }
    dVar10 = (double)(~-(ulong)NAN(dVar1) & (ulong)dVar11 | -(ulong)NAN(dVar1) & (ulong)dVar10);
    dVar1 = (double)local_2c.z;
    dVar11 = dVar1;
    if (dVar1 <= dVar10) {
      dVar11 = dVar10;
    }
    local_378 = (float)(double)(~-(ulong)NAN(dVar10) & (ulong)dVar11 |
                               -(ulong)NAN(dVar10) & (ulong)dVar1);
    if (local_378 < 0.1) {
      local_37c = local_378 / 0.3;
      fVar7 = (float)(**(code **)*local_20)();
      if (local_37c <= fVar7) goto LAB_0013fe9c;
      vVar14 = operator/(in_stack_fffffffffffffb90,(float)((ulong)in_stack_fffffffffffffb88 >> 0x20)
                        );
      local_398._0_8_ = vVar14._0_8_;
      local_388.x = local_398.x;
      local_388.y = local_398.y;
      local_398.z = vVar14.z;
      local_388.z = local_398.z;
      local_2c.x = local_398.x;
      local_2c.y = local_398.y;
      local_2c.z = local_398.z;
      local_398 = vVar14;
    }
    in_stack_fffffffffffffb80 = &local_88.p;
    ::operator*(SUB84(in_stack_fffffffffffffb88,0),in_stack_fffffffffffffb80);
    vVar16 = ::operator+(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    vVar14.z = local_30c.z;
    vVar14.x = local_30c.x;
    vVar14.y = local_30c.y;
    Ray::Ray(&local_3b0,vVar16,vVar14);
    fStack0000000000000008 = local_3b0.origin.x;
    fStack000000000000000c = local_3b0.origin.y;
    fStack0000000000000010 = local_3b0.origin.z;
    fStack0000000000000014 = local_3b0.dir.x;
    fStack0000000000000018 = local_3b0.dir.y;
    fStack000000000000001c = local_3b0.dir.z;
    local_34 = local_34 + 1;
  }
  local_90 = in_RDI + 0x10;
  local_98._M_current =
       (Light **)std::vector<Light_*,_std::allocator<Light_*>_>::begin(in_stack_fffffffffffffb78);
  local_a0 = (Light **)
             std::vector<Light_*,_std::allocator<Light_*>_>::end(in_stack_fffffffffffffb78);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                        *)in_stack_fffffffffffffb80,
                       (__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                        *)in_stack_fffffffffffffb78);
    if (!bVar4) break;
    ppLVar6 = __gnu_cxx::
              __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
              operator*(&local_98);
    local_a8 = *ppLVar6;
    (*local_a8->_vptr_Light[1])(local_a8,&stack0x00000008);
    local_c8 = auVar17._0_4_;
    local_b8 = local_c8;
    vVar14 = ::operator*(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    auVar17._0_4_ = vVar14.z;
    local_e0[0]._0_8_ = vVar14._0_8_;
    local_b4.x = local_e0[0].x;
    local_b4.y = local_e0[0].y;
    local_e0[0] = vVar14;
    local_b4.z = auVar17._0_4_;
    operator+=(&local_c,&local_b4);
    __gnu_cxx::__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
    operator++(&local_98);
  }
LAB_0013fe9c:
  CVar2.z = local_c.z;
  CVar2.x = local_c.x;
  CVar2.y = local_c.y;
  return CVar2;
}

Assistant:

Color Renderer::radiance(Ray ray, Sampler& sampler)
{
	Color through(1);
	Color result;
	bool lastDirac = true; // accept all light sources if directly into camera
	for (int nbounce = 0; nbounce <= max_bounces; nbounce++)
	{
		HitInfo hit = acc->hit(ray);
		if (!hit) {
			for (Light* l: global_lights)
				result += through * l->radiance(ray);
			break;
		}
		if (hit.object->emission) {
			if (lastDirac || !hit.object->emission->samplable)
				result += through * hit.object->emission->radiance(ray);
		}
		BSDF* bsdf = hit.object->bsdf;
		if (!bsdf) break;
		bsdf->bump(hit);
		// direct light
		for (Light* l: samplable_lights) {
			vec3f dirToLight;
			float dist;
			Color irr = l->sampleIrradiance(hit.p, dirToLight, dist, sampler);
			Color f = bsdf->f(-ray.dir, dirToLight, hit);
			if (f == vec3f(0)) continue;
			dist -= geoEPS; // cancel amount that ray origin is moved forward
			// shadow ray test
			Ray shadowray(hit.p + geoEPS * dirToLight, dirToLight);
			HitInfo shadowhit = acc->hit(shadowray);
			if (!shadowhit || norm(shadowhit.p - shadowray.origin) > (1-geoEPS) * dist)
				result += through * irr * f * fabs(dot(hit.Ns, dirToLight));
		}
		// indirect light (bsdf importance sampling)
		vec3f newdir;
		Color f = bsdf->sample_f(-ray.dir, newdir, hit, lastDirac, sampler); // already scaled by 1/pdf
		through *= fabs(dot(newdir, hit.Ns)) * f;
		if (through == vec3f() || !(sqrlen(through) < 1e20)) break;
		// russian roulette
		float t = fmax(fmax(through.x, through.y), through.z);
		if (t < 0.1) {
			float p = t / 0.3;
			if (sampler.get1f() >= p) break;
			through = through / p;
		}
		ray = Ray(hit.p + geoEPS*newdir, newdir);
	}
	return result;
}